

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-surface.c
# Opt level: O1

void plutovg_surface_clear(plutovg_surface_t *surface,plutovg_color_t *color)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  
  uVar1 = plutovg_color_to_argb32(color);
  uVar4 = uVar1 >> 0x18;
  uVar2 = uVar1 >> 0x10 & 0xff;
  uVar5 = uVar1 >> 8 & 0xff;
  uVar3 = uVar1 & 0xff;
  if (uVar4 != 0xff) {
    uVar2 = (uVar2 * uVar4) / 0xff;
    uVar5 = (uVar5 * uVar4) / 0xff;
    uVar3 = (uVar3 * uVar4) / 0xff;
  }
  if (0 < surface->height) {
    iVar6 = 0;
    do {
      plutovg_memfill32((uint *)(surface->data + (long)surface->stride * (long)iVar6),surface->width
                        ,uVar5 << 8 | uVar3 | uVar2 << 0x10 | uVar1 & 0xff000000);
      iVar6 = iVar6 + 1;
    } while (iVar6 < surface->height);
  }
  return;
}

Assistant:

void plutovg_surface_clear(plutovg_surface_t* surface, const plutovg_color_t* color)
{
    uint32_t pixel = plutovg_premultiply_argb(plutovg_color_to_argb32(color));
    for(int y = 0; y < surface->height; y++) {
        uint32_t* pixels = (uint32_t*)(surface->data + surface->stride * y);
        plutovg_memfill32(pixels, surface->width, pixel);
    }
}